

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O2

void absl::lts_20250127::container_internal::ClearBackingArray
               (CommonFields *c,PolicyFunctions *policy,bool reuse,bool soo_enabled)

{
  ulong uVar1;
  ctrl_t *__s;
  undefined7 in_register_00000011;
  size_t capacity;
  
  c->size_ = c->size_ & 1;
  if ((int)CONCAT71(in_register_00000011,reuse) == 0) {
    CommonFields::infoz(c);
    CommonFields::infoz(c);
    (*policy->dealloc)(c,policy);
    c->capacity_ = (ulong)soo_enabled;
    c->size_ = 0;
    (c->heap_or_soo_).heap.control = (ctrl_t *)0x27fca0;
    return;
  }
  uVar1 = c->capacity_;
  if (!soo_enabled || 1 < uVar1) {
    __s = (c->heap_or_soo_).heap.control;
    memset(__s,0x80,uVar1 + 0x10);
    __s[uVar1] = kSentinel;
    ResetGrowthLeft(c);
    CommonFields::infoz(c);
    return;
  }
  __assert_fail("!soo_enabled || c.capacity() > SooCapacity()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                ,0x157,
                "void absl::container_internal::ClearBackingArray(CommonFields &, const PolicyFunctions &, bool, bool)"
               );
}

Assistant:

void ClearBackingArray(CommonFields& c, const PolicyFunctions& policy,
                       bool reuse, bool soo_enabled) {
  c.set_size(0);
  if (reuse) {
    assert(!soo_enabled || c.capacity() > SooCapacity());
    ResetCtrl(c, policy.slot_size);
    ResetGrowthLeft(c);
    c.infoz().RecordStorageChanged(0, c.capacity());
  } else {
    // We need to record infoz before calling dealloc, which will unregister
    // infoz.
    c.infoz().RecordClearedReservation();
    c.infoz().RecordStorageChanged(0, soo_enabled ? SooCapacity() : 0);
    (*policy.dealloc)(c, policy);
    c = soo_enabled ? CommonFields{soo_tag_t{}} : CommonFields{non_soo_tag_t{}};
  }
}